

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::skip_content_with_length(Stream *strm,uint64_t len)

{
  long *plVar1;
  unsigned_long *puVar2;
  ulong in_RSI;
  long *in_RDI;
  ssize_t n;
  size_t read_len;
  uint64_t r;
  char buf [16384];
  unsigned_long local_4038;
  long local_4030;
  unsigned_long local_4028;
  ulong local_4020;
  undefined1 local_4018 [16392];
  ulong local_10;
  long *local_8;
  
  local_4020 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    plVar1 = local_8;
    if (local_10 <= local_4020) {
      return;
    }
    local_4028 = local_10 - local_4020;
    local_4038 = 0x4000;
    puVar2 = std::min<unsigned_long>(&local_4028,&local_4038);
    local_4030 = (**(code **)(*plVar1 + 0x28))(plVar1,local_4018,*puVar2);
    if (local_4030 < 1) break;
    local_4020 = local_4030 + local_4020;
  }
  return;
}

Assistant:

inline void skip_content_with_length(Stream &strm, uint64_t len) {
  char buf[CPPHTTPLIB_RECV_BUFSIZ];
  uint64_t r = 0;
  while (r < len) {
    auto read_len = static_cast<size_t>(len - r);
    auto n = strm.read(buf, (std::min)(read_len, CPPHTTPLIB_RECV_BUFSIZ));
    if (n <= 0) { return; }
    r += static_cast<uint64_t>(n);
  }
}